

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MmapReader.h
# Opt level: O2

void __thiscall MmapReader::grow(MmapReader *this,size_t n)

{
  size_t __len;
  size_t sVar1;
  int iVar2;
  undefined4 extraout_var;
  interprocess_exception *this_00;
  error_info local_40;
  mapped_region newregion;
  
  iVar2 = (*(this->super_MemoryReader).super_ReadWriter._vptr_ReadWriter[6])();
  __len = CONCAT44(extraout_var,iVar2) * 2;
  newregion.m_base = mmap((void *)0x0,__len,3,0x21,-1,0);
  if (newregion.m_base != (void *)0xffffffffffffffff) {
    newregion.m_mode = read_only;
    newregion.m_is_xsi = false;
    newregion.m_page_offset._0_5_ = 0;
    newregion.m_page_offset._5_3_ = 0;
    newregion.m_size = __len;
    memcpy(newregion.m_base,(this->_region).m_base,(this->_region).m_size);
    boost::interprocess::mapped_region::swap(&this->_region,&newregion);
    sVar1 = (this->_region).m_size;
    (this->super_MemoryReader)._mem = (uint8_t *)(this->_region).m_base;
    (this->super_MemoryReader)._size = sVar1;
    boost::interprocess::mapped_region::~mapped_region(&newregion);
    return;
  }
  local_40.m_nat = boost::interprocess::system_error_code();
  local_40.m_ec = boost::interprocess::lookup_error(local_40.m_nat);
  this_00 = (interprocess_exception *)__cxa_allocate_exception(0x30);
  boost::interprocess::interprocess_exception::interprocess_exception(this_00,&local_40,(char *)0x0)
  ;
  __cxa_throw(this_00,&boost::interprocess::interprocess_exception::typeinfo,
              boost::interprocess::interprocess_exception::~interprocess_exception);
}

Assistant:

virtual void grow(size_t n)
    {
        ipc::mapped_region newregion(ipc::anonymous_shared_memory(size()*2));
        memcpy(newregion.get_address(), _region.get_address(), _region.get_size());

        _region.swap(newregion);
        setbuf((uint8_t*)_region.get_address(), _region.get_size());
    }